

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fftheap(fitsfile *fptr,LONGLONG *heapsz,LONGLONG *unused,LONGLONG *overlap,int *valid,
           int *status)

{
  size_t __size;
  int iVar1;
  void *__ptr;
  long *in_RCX;
  long lVar2;
  long *in_RDX;
  size_t *in_RSI;
  int *in_RDI;
  undefined4 *in_R8;
  int *in_R9;
  char message [81];
  char *buffer;
  LONGLONG toverlap;
  LONGLONG tunused;
  LONGLONG offset;
  LONGLONG repeat;
  long nbytes;
  long theapsz;
  long kk;
  long ii;
  int pixsize;
  int typecode;
  int jj;
  undefined7 in_stack_ffffffffffffff10;
  bool bVar3;
  long *in_stack_ffffffffffffff18;
  long *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  fitsfile *in_stack_ffffffffffffff38;
  LONGLONG *in_stack_ffffffffffffff40;
  LONGLONG in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  fitsfile *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff70;
  long lVar4;
  long lVar5;
  fitsfile *in_stack_ffffffffffffff88;
  long local_70;
  long local_68;
  long local_58;
  long local_50;
  int local_40;
  uint local_3c;
  int local_4;
  
  lVar5 = 0;
  lVar4 = 0;
  if (*in_R9 < 1) {
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      iVar1 = ffrdef((fitsfile *)message._8_8_,(int *)message._0_8_);
      if (0 < iVar1) {
        return *in_R9;
      }
    }
    else {
      ffmahd(in_stack_ffffffffffffff88,0,(int *)0x0,in_stack_ffffffffffffff70);
    }
    if (in_R8 != (undefined4 *)0x0) {
      *in_R8 = 1;
    }
    if (in_RSI != (size_t *)0x0) {
      *in_RSI = *(size_t *)(*(long *)(in_RDI + 2) + 0x3e0);
    }
    if (in_RDX != (long *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    if ((*(int *)(*(long *)(in_RDI + 2) + 0x58) == 2) &&
       (*(long *)(*(long *)(in_RDI + 2) + 0x3e0) != 0)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x3e0) <= 0x7fffffffffffffff) {
        __size = *(size_t *)(*(long *)(in_RDI + 2) + 0x3e0);
        __ptr = calloc(1,__size);
        if (__ptr == (void *)0x0) {
          snprintf(&stack0xffffffffffffff18,0x51,"Failed to allocate buffer to test the heap");
          ffpmsg((char *)0x1718ba);
          *in_R9 = 0x71;
          local_4 = 0x71;
        }
        else {
          local_3c = 1;
          while( true ) {
            bVar3 = false;
            if ((int)local_3c <= *(int *)(*(long *)(in_RDI + 2) + 0x3b0)) {
              bVar3 = *in_R9 < 1;
            }
            if (bVar3 == false) break;
            ffgtcl(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (int *)CONCAT17(bVar3,in_stack_ffffffffffffff10));
            if (local_40 < 1) {
              for (local_50 = 1; local_50 <= *(long *)(*(long *)(in_RDI + 2) + 0x3c0);
                  local_50 = local_50 + 1) {
                ffgdesll(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                         in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                         (LONGLONG *)in_stack_ffffffffffffff38,
                         (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
                if (local_40 == -1) {
                  local_68 = (local_70 + 7) / 8;
                }
                else {
                  local_68 = local_70 * (-local_40 / 10);
                }
                if (((long)in_stack_ffffffffffffff88 < 0) ||
                   ((long)__size < (long)&in_stack_ffffffffffffff88->HDUposition + local_68)) {
                  if (in_R8 != (undefined4 *)0x0) {
                    *in_R8 = 0;
                  }
                  snprintf(&stack0xffffffffffffff18,0x51,
                           "Descriptor in row %ld, column %d has invalid heap address",local_50,
                           (ulong)local_3c);
                  ffpmsg((char *)0x171a8d);
                }
                else {
                  for (local_58 = 0; local_58 < local_68; local_58 = local_58 + 1) {
                    lVar2 = (long)&in_stack_ffffffffffffff88->HDUposition + local_58;
                    *(char *)((long)__ptr + lVar2) = *(char *)((long)__ptr + lVar2) + '\x01';
                  }
                }
              }
            }
            local_3c = local_3c + 1;
          }
          for (local_58 = 0; local_58 < (long)__size; local_58 = local_58 + 1) {
            if (*(char *)((long)__ptr + local_58) == '\0') {
              lVar5 = lVar5 + 1;
            }
            else if ('\x01' < *(char *)((long)__ptr + local_58)) {
              lVar4 = lVar4 + 1;
            }
          }
          if (in_RSI != (size_t *)0x0) {
            *in_RSI = __size;
          }
          if (in_RDX != (long *)0x0) {
            *in_RDX = lVar5;
          }
          if (in_RCX != (long *)0x0) {
            *in_RCX = lVar4;
          }
          free(__ptr);
          local_4 = *in_R9;
        }
      }
      else {
        ffpmsg((char *)0x171840);
        *in_R9 = 0x71;
        local_4 = 0x71;
      }
    }
    else {
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int fftheap(fitsfile *fptr, /* I - FITS file pointer                         */
           LONGLONG *heapsz,   /* O - current size of the heap               */
           LONGLONG *unused,   /* O - no. of unused bytes in the heap        */
           LONGLONG *overlap,  /* O - no. of bytes shared by > 1 descriptors */
           int  *valid,     /* O - are all the heap addresses valid?         */
           int *status)     /* IO - error status                             */
/*
  Tests the contents of the binary table variable length array heap.
  Returns the number of bytes that are currently not pointed to by any
  of the descriptors, and also the number of bytes that are pointed to
  by more than one descriptor.  It returns valid = FALSE if any of the
  descriptors point to addresses that are out of the bounds of the
  heap.
*/
{
    int jj, typecode, pixsize;
    long ii, kk, theapsz, nbytes;
    LONGLONG repeat, offset, tunused = 0, toverlap = 0;
    char *buffer, message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if ( fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header to make sure everything is up to date */
    else if ( ffrdef(fptr, status) > 0)               
        return(*status);

    if (valid) *valid = TRUE;
    if (heapsz) *heapsz = (fptr->Fptr)->heapsize;
    if (unused) *unused = 0;
    if (overlap) *overlap = 0;
    
    /* return if this is not a binary table HDU or if the heap is empty */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 )
        return(*status);

    if ((fptr->Fptr)->heapsize > LONG_MAX) {
        ffpmsg("Heap is too big to test ( > 2**31 bytes). (fftheap)");
        return(*status = MEMORY_ALLOCATION);
    }

    theapsz = (long) (fptr->Fptr)->heapsize;
    buffer = calloc(1, theapsz);     /* allocate temp space */
    if (!buffer )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to test the heap");
        ffpmsg(message);
        return(*status = MEMORY_ALLOCATION);
    }

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(fptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(fptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            if (offset < 0 || offset + nbytes > theapsz)
            {
                if (valid) *valid = FALSE;  /* address out of bounds */
                snprintf(message,FLEN_ERRMSG,
                "Descriptor in row %ld, column %d has invalid heap address",
                ii, jj);
                ffpmsg(message);
            }
            else
            {
                for (kk = 0; kk < nbytes; kk++)
                    buffer[kk + offset]++;   /* increment every used byte */
            }
        }
    }

    for (kk = 0; kk < theapsz; kk++)
    {
        if (buffer[kk] == 0)
            tunused++;
        else if (buffer[kk] > 1)
            toverlap++;
    }

    if (heapsz) *heapsz = theapsz;
    if (unused) *unused = tunused;
    if (overlap) *overlap = toverlap;

    free(buffer);
    return(*status);
}